

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::set_defaultstringlabel
          (KNearestNeighborsClassifier *this,string *value)

{
  if (this->_oneof_case_[1] != 0x6e) {
    clear_DefaultClassLabel(this);
    this->_oneof_case_[1] = 0x6e;
    this->DefaultClassLabel_ =
         (DefaultClassLabelUnion)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&(this->DefaultClassLabel_).defaultstringlabel_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,value);
  return;
}

Assistant:

inline void KNearestNeighborsClassifier::set_defaultstringlabel(const ::std::string& value) {
  // @@protoc_insertion_point(field_set:CoreML.Specification.KNearestNeighborsClassifier.defaultStringLabel)
  if (!has_defaultstringlabel()) {
    clear_DefaultClassLabel();
    set_has_defaultstringlabel();
    DefaultClassLabel_.defaultstringlabel_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  DefaultClassLabel_.defaultstringlabel_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), value);
  // @@protoc_insertion_point(field_set:CoreML.Specification.KNearestNeighborsClassifier.defaultStringLabel)
}